

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int connectionIsBusy(sqlite3 *db)

{
  long lVar1;
  long lVar2;
  
  if (db->pVdbe != (Vdbe *)0x0) {
    return 1;
  }
  if (0 < (long)db->nDb) {
    lVar2 = 0;
    do {
      lVar1 = *(long *)((long)&db->aDb->pBt + lVar2);
      if ((lVar1 != 0) && (*(int *)(lVar1 + 0x18) != 0)) {
        return 1;
      }
      lVar2 = lVar2 + 0x20;
    } while ((long)db->nDb * 0x20 != lVar2);
  }
  return 0;
}

Assistant:

static int connectionIsBusy(sqlite3 *db){
  int j;
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->pVdbe ) return 1;
  for(j=0; j<db->nDb; j++){
    Btree *pBt = db->aDb[j].pBt;
    if( pBt && sqlite3BtreeIsInBackup(pBt) ) return 1;
  }
  return 0;
}